

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

void __thiscall kj::HttpServer::Connection::~Connection(Connection *this)

{
  uint uVar1;
  PromiseFulfiller<void> *pPVar2;
  undefined1 local_25 [13];
  Own<kj::PromiseFulfiller<void>_> *local_18;
  Own<kj::PromiseFulfiller<void>_> *f;
  Connection *this_local;
  
  uVar1 = this->server->connectionCount - 1;
  this->server->connectionCount = uVar1;
  f = (Own<kj::PromiseFulfiller<void>_> *)this;
  if ((uVar1 == 0) &&
     (local_18 = _::readMaybe<kj::PromiseFulfiller<void>>(&this->server->zeroConnectionsFulfiller),
     local_18 != (Own<kj::PromiseFulfiller<void>_> *)0x0)) {
    pPVar2 = Own<kj::PromiseFulfiller<void>_>::get(local_18);
    (**pPVar2->_vptr_PromiseFulfiller)(pPVar2,local_25);
  }
  Maybe<kj::Promise<bool>_>::~Maybe(&this->webSocketError);
  Maybe<kj::HttpMethod>::~Maybe(&this->currentMethod);
  anon_unknown_31::HttpOutputStream::~HttpOutputStream(&this->httpOutput);
  anon_unknown_31::HttpInputStreamImpl::~HttpInputStreamImpl(&this->httpInput);
  return;
}

Assistant:

~Connection() noexcept(false) {
    if (--server.connectionCount == 0) {
      KJ_IF_MAYBE(f, server.zeroConnectionsFulfiller) {
        f->get()->fulfill();
      }
    }
  }